

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_StArrAtomic<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  uchar uVar4;
  short sVar5;
  unsigned_short uVar6;
  uint uVar7;
  uint32 byteLength_00;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 *puVar11;
  uint64 index_00;
  WebAssemblyMemory *this_00;
  ArrayBufferBase *pAVar12;
  undefined4 extraout_var;
  long *buffer_01;
  long lVar13;
  char *pcVar14;
  uchar *puVar15;
  short *psVar16;
  unsigned_short *puVar17;
  int *piVar18;
  uint *puVar19;
  int64 iVar20;
  uint32 storedValue_12;
  uint32 value_12;
  uint32 *readBuffer_12;
  int32 storedValue_11;
  int32 value_11;
  int32 *readBuffer_11;
  uint16 storedValue_10;
  uint16 value_10;
  uint16 *readBuffer_10;
  int16 storedValue_9;
  int16 value_9;
  int16 *readBuffer_9;
  uint8 storedValue_8;
  uint8 value_8;
  uint8 *readBuffer_8;
  int8 storedValue_7;
  int8 value_7;
  int8 *readBuffer_7;
  int64 storedValue_6;
  int64 value_6;
  int64 *readBuffer_6;
  uint32 storedValue_5;
  uint32 value_5;
  uint32 *readBuffer_5;
  int32 storedValue_4;
  int32 value_4;
  int32 *readBuffer_4;
  uint16 storedValue_3;
  uint16 value_3;
  uint16 *readBuffer_3;
  int16 storedValue_2;
  int16 value_2;
  int16 *readBuffer_2;
  uint8 storedValue_1;
  uint8 value_1;
  uint8 *readBuffer_1;
  int8 storedValue;
  int8 value;
  int8 *readBuffer;
  BYTE *buffer;
  uint32 byteLength;
  ArrayBufferBase *arr;
  uint64 index;
  OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  byte *buffer_00;
  
  bVar2 = Wasm::Threads::IsEnabled();
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2372,"(Wasm::Threads::IsEnabled())","Wasm::Threads::IsEnabled()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2373,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  uVar10 = playout->Offset;
  uVar7 = GetRegRawInt<unsigned_short>(this,playout->SlotIndex);
  index_00 = (ulong)uVar10 + (ulong)uVar7;
  this_00 = GetWebAssemblyMemory(this);
  pAVar12 = WebAssemblyMemory::GetBuffer(this_00);
  byteLength_00 =
       (*(pAVar12->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  iVar8 = (*(pAVar12->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
  buffer_00 = (byte *)CONCAT44(extraout_var,iVar8);
  switch(playout->ViewType) {
  case TYPE_INT8:
    pcVar14 = WasmAtomicsArrayBoundsCheck<char>(this,buffer_00,index_00,byteLength_00);
    iVar8 = GetRegRaw<int>(this,(uint)playout->Value);
    cVar3 = AtomicsOperations::Store<char>(pcVar14,(char)iVar8);
    if (cVar3 != (char)iVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x15,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_UINT8:
    puVar15 = WasmAtomicsArrayBoundsCheck<unsigned_char>(this,buffer_00,index_00,byteLength_00);
    iVar8 = GetRegRaw<int>(this,(uint)playout->Value);
    uVar4 = AtomicsOperations::Store<unsigned_char>(puVar15,(uchar)iVar8);
    if (uVar4 != (uchar)iVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x16,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_INT16:
    psVar16 = WasmAtomicsArrayBoundsCheck<short>(this,buffer_00,index_00,byteLength_00);
    iVar8 = GetRegRaw<int>(this,(uint)playout->Value);
    sVar5 = AtomicsOperations::Store<short>(psVar16,(short)iVar8);
    if (sVar5 != (short)iVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x17,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_UINT16:
    puVar17 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer_00,index_00,byteLength_00);
    iVar8 = GetRegRaw<int>(this,(uint)playout->Value);
    uVar6 = AtomicsOperations::Store<unsigned_short>(puVar17,(unsigned_short)iVar8);
    if (uVar6 != (unsigned_short)iVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x18,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_INT32:
    piVar18 = WasmAtomicsArrayBoundsCheck<int>(this,buffer_00,index_00,byteLength_00);
    iVar8 = GetRegRaw<int>(this,(uint)playout->Value);
    iVar9 = AtomicsOperations::Store<int>(piVar18,iVar8);
    if (iVar9 != iVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x19,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_UINT32:
    puVar19 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer_00,index_00,byteLength_00);
    uVar10 = GetRegRaw<int>(this,(uint)playout->Value);
    uVar7 = AtomicsOperations::Store<unsigned_int>(puVar19,uVar10);
    if (uVar7 != uVar10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x1a,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2384,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
    break;
  case TYPE_INT64:
    buffer_01 = WasmAtomicsArrayBoundsCheck<long>(this,buffer_00,index_00,byteLength_00);
    iVar20 = GetRegRaw<long>(this,(uint)playout->Value);
    lVar13 = AtomicsOperations::Store<long>(buffer_01,iVar20);
    if (lVar13 != iVar20) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x1d,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_INT8_TO_INT64:
    pcVar14 = WasmAtomicsArrayBoundsCheck<char>(this,buffer_00,index_00,byteLength_00);
    iVar20 = GetRegRaw<long>(this,(uint)playout->Value);
    cVar3 = AtomicsOperations::Store<char>(pcVar14,(char)iVar20);
    if (cVar3 != (char)iVar20) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x1e,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_UINT8_TO_INT64:
    puVar15 = WasmAtomicsArrayBoundsCheck<unsigned_char>(this,buffer_00,index_00,byteLength_00);
    iVar20 = GetRegRaw<long>(this,(uint)playout->Value);
    uVar4 = AtomicsOperations::Store<unsigned_char>(puVar15,(uchar)iVar20);
    if (uVar4 != (uchar)iVar20) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x1f,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_INT16_TO_INT64:
    psVar16 = WasmAtomicsArrayBoundsCheck<short>(this,buffer_00,index_00,byteLength_00);
    iVar20 = GetRegRaw<long>(this,(uint)playout->Value);
    sVar5 = AtomicsOperations::Store<short>(psVar16,(short)iVar20);
    if (sVar5 != (short)iVar20) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x20,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_UINT16_TO_INT64:
    puVar17 = WasmAtomicsArrayBoundsCheck<unsigned_short>(this,buffer_00,index_00,byteLength_00);
    iVar20 = GetRegRaw<long>(this,(uint)playout->Value);
    uVar6 = AtomicsOperations::Store<unsigned_short>(puVar17,(unsigned_short)iVar20);
    if (uVar6 != (unsigned_short)iVar20) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x21,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_INT32_TO_INT64:
    piVar18 = WasmAtomicsArrayBoundsCheck<int>(this,buffer_00,index_00,byteLength_00);
    iVar20 = GetRegRaw<long>(this,(uint)playout->Value);
    iVar8 = AtomicsOperations::Store<int>(piVar18,(int)iVar20);
    if (iVar8 != (int)iVar20) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x22,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    break;
  case TYPE_UINT32_TO_INT64:
    puVar19 = WasmAtomicsArrayBoundsCheck<unsigned_int>(this,buffer_00,index_00,byteLength_00);
    iVar20 = GetRegRaw<long>(this,(uint)playout->Value);
    uVar10 = AtomicsOperations::Store<unsigned_int>(puVar19,(uint)iVar20);
    if (uVar10 != (uint)iVar20) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsArrayBufferViews.h"
                                  ,0x23,"(storedValue == value)","storedValue == value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_StArrAtomic(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(Wasm::Threads::IsEnabled());
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW_INT(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: {\
            MemType* readBuffer = WasmAtomicsArrayBoundsCheck<MemType>(buffer, index, byteLength); \
            MemType value = (MemType)GetRegRaw<RegType>(playout->Value); \
            MemType storedValue = AtomicsOperations::Store<MemType>(readBuffer, value); \
            Assert(storedValue == value); \
            return; \
        }
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }